

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

void cmd_set_repeat(wchar_t nrepeats)

{
  uint32_t *puVar1;
  
  repeating = nrepeats != L'\0';
  cmd_queue[cmd_tail + ((cmd_tail + L'\x13') / 0x14) * -0x14 + 0x13].nrepeats = nrepeats;
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x8000;
  return;
}

Assistant:

void cmd_set_repeat(int nrepeats)
{
	struct command *cmd = &cmd_queue[prev_cmd_idx(cmd_tail)];

	cmd->nrepeats = nrepeats;
	if (nrepeats) repeating = true;
	else repeating = false;

	/* Redraw the state (later) */
	player->upkeep->redraw |= (PR_STATE);
}